

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_snap_functions.cc
# Opt level: O0

void __thiscall s2builderutil::S2CellIdSnapFunction::set_level(S2CellIdSnapFunction *this,int level)

{
  ostream *poVar1;
  S1Angle snap_radius;
  S2LogMessage local_50;
  S2LogMessageVoidify local_3d [20];
  byte local_29;
  S2LogMessage local_28;
  S2LogMessageVoidify local_15;
  int local_14;
  S2CellIdSnapFunction *pSStack_10;
  int level_local;
  S2CellIdSnapFunction *this_local;
  
  local_29 = 0;
  local_14 = level;
  pSStack_10 = this;
  if (level < 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_snap_functions.cc"
               ,0x58,kFatal,(ostream *)&std::cerr);
    local_29 = 1;
    poVar1 = S2LogMessage::stream(&local_28);
    poVar1 = std::operator<<(poVar1,"Check failed: (level) >= (0) ");
    S2LogMessageVoidify::operator&(&local_15,poVar1);
  }
  if ((local_29 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
  }
  if (0x1e < local_14) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_snap_functions.cc"
               ,0x59,kFatal,(ostream *)&std::cerr);
    poVar1 = S2LogMessage::stream(&local_50);
    poVar1 = std::operator<<(poVar1,"Check failed: (level) <= (S2CellId::kMaxLevel) ");
    S2LogMessageVoidify::operator&(local_3d,poVar1);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_50);
  }
  this->level_ = local_14;
  snap_radius = MinSnapRadiusForLevel(local_14);
  set_snap_radius(this,snap_radius);
  return;
}

Assistant:

void S2CellIdSnapFunction::set_level(int level) {
  S2_DCHECK_GE(level, 0);
  S2_DCHECK_LE(level, S2CellId::kMaxLevel);
  level_ = level;
  set_snap_radius(MinSnapRadiusForLevel(level));
}